

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O1

void Wln_ObjAddFanin(Wln_Ntk_t *p,int iObj,int i)

{
  Wln_Vec_t *pWVar1;
  int iVar2;
  int *piVar3;
  
  pWVar1 = p->vFanins + iObj;
  iVar2 = p->vFanins[iObj].nSize;
  if (iVar2 < 2) {
    iVar2 = pWVar1->nSize;
    pWVar1->nSize = iVar2 + 1;
    *(int *)((long)&pWVar1->field_2 + (long)iVar2 * 4) = i;
  }
  else if (iVar2 == 2) {
    piVar3 = (int *)malloc(0x10);
    *piVar3 = (pWVar1->field_2).Array[0];
    piVar3[1] = (pWVar1->field_2).Array[1];
    piVar3[2] = i;
    (pWVar1->field_2).pArray[0] = piVar3;
    pWVar1->nCap = 4;
    pWVar1->nSize = 3;
  }
  else {
    iVar2 = pWVar1->nSize;
    if (iVar2 == pWVar1->nCap) {
      pWVar1->nCap = iVar2 * 2;
      if ((pWVar1->field_2).pArray[0] == (int *)0x0) {
        piVar3 = (int *)malloc((long)iVar2 << 3);
      }
      else {
        piVar3 = (int *)realloc((pWVar1->field_2).pArray[0],(long)iVar2 << 3);
      }
      (pWVar1->field_2).pArray[0] = piVar3;
    }
    iVar2 = pWVar1->nSize;
    if (pWVar1->nCap <= iVar2) {
      __assert_fail("pVec->nSize < pVec->nCap",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnObj.c"
                    ,0x5e,"void Wln_ObjAddFanin(Wln_Ntk_t *, int, int)");
    }
    pWVar1->nSize = iVar2 + 1;
    (pWVar1->field_2).pArray[0][iVar2] = i;
  }
  return;
}

Assistant:

void Wln_ObjAddFanin( Wln_Ntk_t * p, int iObj, int i )        
{ 
    Wln_Vec_t * pVec = p->vFanins + iObj;
    if ( Wln_ObjFaninNum(p, iObj) < 2 )
        pVec->Array[pVec->nSize++] = i;
    else if ( Wln_ObjFaninNum(p, iObj) == 2 )
    {
        int * pArray = ABC_ALLOC( int, 4 );
        pArray[0] = pVec->Array[0];
        pArray[1] = pVec->Array[1];
        pArray[2] = i;
        pVec->pArray[0] = pArray;
        pVec->nSize     = 3;
        pVec->nCap      = 4;
    }
    else 
    {
        if ( pVec->nSize == pVec->nCap )
            pVec->pArray[0] = ABC_REALLOC( int, pVec->pArray[0], (pVec->nCap = 2*pVec->nSize) ); 
        assert( pVec->nSize < pVec->nCap );
        pVec->pArray[0][pVec->nSize++] = i;
    }
}